

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSequences
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,U32 *workspace,int bmi2)

{
  uint uVar1;
  size_t sVar2;
  long in_RDX;
  ulong in_R9;
  ulong in_stack_00000008;
  size_t maxCSize;
  size_t cSize;
  size_t in_stack_000001b0;
  void *in_stack_000001b8;
  ZSTD_CCtx_params *in_stack_000001c0;
  ZSTD_entropyCTables_t *in_stack_000001c8;
  ZSTD_entropyCTables_t *in_stack_000001d0;
  seqStore_t *in_stack_000001d8;
  U32 *in_stack_00000210;
  int in_stack_00000218;
  undefined8 local_8;
  
  local_8 = ZSTD_compressSequences_internal
                      (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                       in_stack_000001b8,in_stack_000001b0,in_stack_00000210,in_stack_00000218);
  if (local_8 == 0xffffffffffffffba && in_stack_00000008 <= in_R9) {
    local_8 = 0;
  }
  else {
    uVar1 = ZSTD_isError(0x1fb42c);
    if (uVar1 == 0) {
      sVar2 = ZSTD_minGain(in_stack_00000008);
      if (local_8 < in_stack_00000008 - sVar2) {
        if (*(int *)(in_RDX + 0x11d8) == 2) {
          *(undefined4 *)(in_RDX + 0x11d8) = 1;
        }
      }
      else {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

MEM_STATIC size_t ZSTD_compressSequences(seqStore_t* seqStorePtr,
                              ZSTD_entropyCTables_t const* prevEntropy,
                              ZSTD_entropyCTables_t* nextEntropy,
                              ZSTD_CCtx_params const* cctxParams,
                              void* dst, size_t dstCapacity,
                              size_t srcSize, U32* workspace, int bmi2)
{
    size_t const cSize = ZSTD_compressSequences_internal(
            seqStorePtr, prevEntropy, nextEntropy, cctxParams, dst, dstCapacity,
            workspace, bmi2);
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity))
        return 0;  /* block not compressed */
    if (ZSTD_isError(cSize)) return cSize;

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize);  /* note : fixed formula, maybe should depend on compression level, or strategy */
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }

    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (nextEntropy->offcode_repeatMode == FSE_repeat_valid)
        nextEntropy->offcode_repeatMode = FSE_repeat_check;

    return cSize;
}